

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>
                   (string *__return_storage_ptr__,char (*a) [8],long *b,char (*args) [17],
                   unsigned_long *args_1,char (*args_2) [3],unsigned_long *args_3,char (*args_4) [2]
                   )

{
  cmAlphaNum *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_180 [56];
  undefined1 local_148 [56];
  undefined1 local_110 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  size_t local_c0;
  string *local_b8;
  cmAlphaNum *local_b0;
  size_t local_a8;
  char (*local_a0) [17];
  undefined8 local_98;
  size_t local_90;
  string *local_88;
  cmAlphaNum *local_80;
  size_t local_78;
  char (*local_70) [3];
  undefined8 local_68;
  size_t local_60;
  string *local_58;
  cmAlphaNum *local_50;
  size_t local_48;
  char (*local_40) [2];
  undefined8 local_38;
  
  local_d8.first._M_len = strlen(*a);
  local_d8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_d8.first._M_str = *a;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_110,*b);
  pcVar1 = (cmAlphaNum *)(local_110 + 0x10);
  if ((cmAlphaNum *)local_110._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_110._0_8_;
  }
  local_b8 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_110;
  if ((cmAlphaNum *)local_110._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_110._0_8_;
  }
  local_c0 = (pcVar1->View_)._M_len;
  local_b0 = (cmAlphaNum *)local_110._0_8_;
  local_a8 = strlen(*args);
  local_98 = 0;
  local_a0 = args;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_148,*args_1);
  pcVar1 = (cmAlphaNum *)(local_148 + 0x10);
  if ((cmAlphaNum *)local_148._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_148._0_8_;
  }
  local_88 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_148;
  if ((cmAlphaNum *)local_148._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_148._0_8_;
  }
  local_90 = (pcVar1->View_)._M_len;
  local_80 = (cmAlphaNum *)local_148._0_8_;
  local_78 = strlen(*args_2);
  local_68 = 0;
  local_70 = args_2;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_180,*args_3);
  pcVar1 = (cmAlphaNum *)(local_180 + 0x10);
  if ((cmAlphaNum *)local_180._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_180._0_8_;
  }
  local_58 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_180;
  if ((cmAlphaNum *)local_180._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_180._0_8_;
  }
  local_60 = (pcVar1->View_)._M_len;
  local_50 = (cmAlphaNum *)local_180._0_8_;
  local_48 = strlen(*args_4);
  local_40 = args_4;
  local_38 = 0;
  views._M_len = 7;
  views._M_array = &local_d8;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}